

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O0

CharTypes Js::CharClassifier::GetBigCharTypeES6(codepoint_t ch,CharClassifier *instance)

{
  code *pcVar1;
  bool bVar2;
  UnicodeGeneralCategoryClass UVar3;
  undefined4 *puVar4;
  UnicodeGeneralCategoryClass categoryClass;
  CharClassifier *instance_local;
  codepoint_t ch_local;
  
  if (ch < 0x80) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharClassifier.cpp"
                                ,0xfd,"(ch > 0x7F)","ch > 0x7F");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (ch == 0xfeff) {
    instance_local._4_4_ = _C_WSP;
  }
  else {
    UVar3 = PlatformAgnostic::UnicodeText::GetGeneralCategoryClass(ch);
    switch(UVar3) {
    case CategoryClassLetter:
      instance_local._4_4_ = _C_LET;
      break;
    case CategoryClassDigit:
      instance_local._4_4_ = _C_DIG;
      break;
    case CategoryClassLineSeparator:
    case CategoryClassParagraphSeparator:
      instance_local._4_4_ = _C_NWL;
      break;
    case CategoryClassSpaceSeparator:
    case CategoryClassSpacingCombiningMark:
    case CategoryClassNonSpacingMark:
    case CategoryClassConnectorPunctuation:
      instance_local._4_4_ = _C_WSP;
      break;
    default:
      instance_local._4_4_ = _C_UNK;
    }
  }
  return instance_local._4_4_;
}

Assistant:

CharTypes Js::CharClassifier::GetBigCharTypeES6(codepoint_t ch, const Js::CharClassifier *instance)
{
    using namespace PlatformAgnostic::UnicodeText;

    Assert(ch > 0x7F);
    if (ch == 0xFEFF)
    {
        return CharTypes::_C_WSP;
    }

    UnicodeGeneralCategoryClass categoryClass = PlatformAgnostic::UnicodeText::GetGeneralCategoryClass(ch);

    switch(categoryClass)
    {
        case UnicodeGeneralCategoryClass::CategoryClassLetter:
            return CharTypes::_C_LET;
        case UnicodeGeneralCategoryClass::CategoryClassDigit:
            return CharTypes::_C_DIG;
        case UnicodeGeneralCategoryClass::CategoryClassLineSeparator:
        case UnicodeGeneralCategoryClass::CategoryClassParagraphSeparator:
            return CharTypes::_C_NWL;
        case UnicodeGeneralCategoryClass::CategoryClassSpaceSeparator:
        case UnicodeGeneralCategoryClass::CategoryClassSpacingCombiningMark:
        case UnicodeGeneralCategoryClass::CategoryClassNonSpacingMark:
        case UnicodeGeneralCategoryClass::CategoryClassConnectorPunctuation:
            return CharTypes::_C_WSP;
        default:
            break;
    }

    return CharTypes::_C_UNK;
}